

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

pair<Vector3<double>,_Vector3<double>_> * __thiscall
S2::GetEdgePairClosestPoints
          (pair<Vector3<double>,_Vector3<double>_> *__return_storage_ptr__,S2 *this,S2Point *a0,
          S2Point *a1,S2Point *b0,S2Point *b1)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  S2LogMessage local_c0;
  S2Point local_b0;
  S2Point local_98;
  S2Point local_80;
  S2Point local_68;
  undefined4 local_4c;
  anon_enum_32 closest_vertex;
  S1ChordAngle min_dist;
  S2Point x;
  S2Point *b1_local;
  S2Point *b0_local;
  S2Point *a1_local;
  S2Point *a0_local;
  
  iVar2 = CrossingSign((S2Point *)this,a0,a1,b0);
  if (iVar2 < 1) {
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)&stack0xffffffffffffffb8);
    AlwaysUpdateMinDistance<true>((S2Point *)this,a1,b0,(S1ChordAngle *)&stack0xffffffffffffffb8);
    local_4c = 0;
    bVar1 = UpdateMinDistance(a0,a1,b0,(S1ChordAngle *)&stack0xffffffffffffffb8);
    if (bVar1) {
      local_4c = 1;
    }
    bVar1 = UpdateMinDistance(a1,(S2Point *)this,a0,(S1ChordAngle *)&stack0xffffffffffffffb8);
    if (bVar1) {
      local_4c = 2;
    }
    bVar1 = UpdateMinDistance(b0,(S2Point *)this,a0,(S1ChordAngle *)&stack0xffffffffffffffb8);
    if (bVar1) {
      local_4c = 3;
    }
    switch(local_4c) {
    case 0:
      Project(&local_68,(S2Point *)this,a1,b0);
      std::make_pair<Vector3<double>const&,Vector3<double>>
                (__return_storage_ptr__,(Vector3<double> *)this,&local_68);
      break;
    case 1:
      Project(&local_80,a0,a1,b0);
      std::make_pair<Vector3<double>const&,Vector3<double>>(__return_storage_ptr__,a0,&local_80);
      break;
    case 2:
      Project(&local_98,a1,(S2Point *)this,a0);
      std::make_pair<Vector3<double>,Vector3<double>const&>(__return_storage_ptr__,&local_98,a1);
      break;
    case 3:
      Project(&local_b0,b0,(S2Point *)this,a0);
      std::make_pair<Vector3<double>,Vector3<double>const&>(__return_storage_ptr__,&local_b0,b0);
      break;
    default:
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x14b,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_c0);
      std::operator<<(poVar3,"Unreached (to suppress Android compiler warning)");
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_c0);
    }
  }
  else {
    GetIntersection((S2Point *)&min_dist,this,a0,a1,b0,b1);
    std::make_pair<Vector3<double>&,Vector3<double>&>
              (__return_storage_ptr__,(Vector3<double> *)&min_dist,(Vector3<double> *)&min_dist);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<S2Point, S2Point> GetEdgePairClosestPoints(
      const S2Point& a0, const S2Point& a1,
      const S2Point& b0, const S2Point& b1) {
  if (S2::CrossingSign(a0, a1, b0, b1) > 0) {
    S2Point x = S2::GetIntersection(a0, a1, b0, b1);
    return std::make_pair(x, x);
  }
  // We save some work by first determining which vertex/edge pair achieves
  // the minimum distance, and then computing the closest point on that edge.
  S1ChordAngle min_dist;
  AlwaysUpdateMinDistance<true>(a0, b0, b1, &min_dist);
  enum { A0, A1, B0, B1 } closest_vertex = A0;
  if (UpdateMinDistance(a1, b0, b1, &min_dist)) { closest_vertex = A1; }
  if (UpdateMinDistance(b0, a0, a1, &min_dist)) { closest_vertex = B0; }
  if (UpdateMinDistance(b1, a0, a1, &min_dist)) { closest_vertex = B1; }
  switch (closest_vertex) {
    case A0: return std::make_pair(a0, Project(a0, b0, b1));
    case A1: return std::make_pair(a1, Project(a1, b0, b1));
    case B0: return std::make_pair(Project(b0, a0, a1), b0);
    case B1: return std::make_pair(Project(b1, a0, a1), b1);
    default: S2_LOG(FATAL) << "Unreached (to suppress Android compiler warning)";
  }
}